

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O2

bool __thiscall
libtorrent::anon_unknown_6::ut_pex_peer_plugin::on_extended
          (ut_pex_peer_plugin *this,int length,int msg,span<const_char> body)

{
  byte bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  anon_union_16_3_a3f0114d_for___in6_u aVar6;
  bool bVar7;
  int iVar8;
  type_t tVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  address_v4 aVar14;
  torrent_flags_t tVar15;
  _func_int **pp_Var16;
  time_point tVar17;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  _Var18;
  char *pcVar19;
  session_settings *psVar20;
  short *psVar21;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  _Var22;
  undefined4 extraout_var_00;
  undefined8 uVar23;
  long lVar24;
  bdecode_node *in;
  bdecode_node *extraout_RDX;
  bdecode_node *extraout_RDX_00;
  bdecode_node *extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  char **extraout_RDX_09;
  char **extraout_RDX_10;
  char **extraout_RDX_11;
  char **extraout_RDX_12;
  char **ppcVar25;
  bool bVar26;
  peer_connection *ppVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  int local_238;
  uint local_22c;
  value_type v;
  undefined2 uStack_222;
  in6_addr_type local_220;
  ulong local_210;
  value_type v_2;
  char *in_1;
  anon_union_16_3_a3f0114d_for___in6_u aStack_1c0;
  ulong local_1b0;
  bdecode_node p6f;
  bdecode_node p6;
  char *in_2;
  uchar auStack_120 [8];
  ushort local_118;
  char *in_3;
  bdecode_node p;
  bdecode_node pf;
  bdecode_node pex_msg;
  error_code ec;
  undefined4 extraout_var;
  
  bVar30 = this->m_message_index != 0;
  bVar26 = bVar30 && msg == 1;
  if (!bVar30 || msg != 1) {
    return bVar26;
  }
  tVar15 = aux::torrent::flags(this->m_torrent);
  if (((uint)tVar15.m_val >> 0x15 & 1) != 0) {
    return bVar26;
  }
  if (0x7d000 < length) {
    ppVar27 = this->m_pc;
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&pex_msg,pex_message_too_large,(type *)0x0);
    pp_Var16 = (ppVar27->super_bandwidth_socket)._vptr_bandwidth_socket;
    uVar23 = 2;
LAB_00347748:
    (*pp_Var16[0x14])(ppVar27,&pex_msg,1,uVar23);
    return bVar26;
  }
  if ((int)body.m_len < length) {
    return bVar26;
  }
  tVar17 = aux::time_now();
  if ((long)tVar17.__d.__r + -60000000000 < this->m_last_pex[0].__d.__r) {
    ppVar27 = this->m_pc;
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&pex_msg,too_frequent_pex,(type *)0x0);
    pp_Var16 = (ppVar27->super_bandwidth_socket)._vptr_bandwidth_socket;
    uVar23 = 0;
    goto LAB_00347748;
  }
  for (lVar24 = 0; lVar24 != 5; lVar24 = lVar24 + 1) {
    this->m_last_pex[lVar24].__d.__r = this->m_last_pex[lVar24 + 1].__d.__r;
  }
  this->m_last_pex[5].__d.__r = (rep)tVar17.__d.__r;
  pex_msg._32_12_ = SUB1612((undefined1  [16])0x0,4);
  pex_msg._16_12_ = SUB1612((undefined1  [16])0x0,0);
  pex_msg.m_root_tokens._4_4_ = 0;
  pex_msg.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pex_msg.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pex_msg.m_token_idx = -1;
  pex_msg.m_last_index = -1;
  pex_msg.m_last_token = -1;
  pex_msg.m_size = -1;
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  iVar8 = bdecode(body.m_ptr,body.m_ptr + body.m_len,&pex_msg,&ec,(int *)0x0,100,2000000);
  if ((iVar8 != 0) || (tVar9 = bdecode_node::type(&pex_msg), tVar9 != dict_t)) {
    ppVar27 = this->m_pc;
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&p,invalid_pex_message,(type *)0x0);
    (*(ppVar27->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar27,&p,1,2);
    goto LAB_003479fe;
  }
  key._M_str = "dropped";
  key._M_len = 7;
  bdecode_node::dict_find_string(&p,&pex_msg,key);
  bVar30 = bdecode_node::operator_cast_to_bool(&p);
  iVar8 = 0;
  if (bVar30) {
    iVar8 = bdecode_node::string_length(&p);
    iVar8 = iVar8 / 6;
  }
  bVar30 = bdecode_node::operator_cast_to_bool(&p);
  if (bVar30) {
    iVar10 = bdecode_node::string_length(&p);
    p6f.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&p);
    in = &p6f;
    uVar28 = 0;
    if (0 < (int)((long)iVar10 / 6)) {
      uVar28 = (long)iVar10 / 6 & 0xffffffff;
    }
    while (iVar10 = (int)uVar28, uVar28 = (ulong)(iVar10 - 1), iVar10 != 0) {
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&p6,(aux *)&p6f,(char **)in);
      if ((short)p6.m_tokens.
                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_start != 2) {
        pf.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             p6.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pf.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             p6.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pf.m_root_tokens = (bdecode_token *)((ulong)p6.m_root_tokens & 0xffffffff);
        pf.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      }
      else {
        pf.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pf.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pf.m_root_tokens = (bdecode_token *)0x0;
        pf.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ =
             (in_addr_t)
             p6.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_;
      }
      pf.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (uint)((short)p6.m_tokens.
                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         ._M_impl.super__Vector_impl_data._M_start != 2);
      boost::asio::ip::address::to_v4((address *)&in_1);
      pcVar19 = in_1;
      v.first._M_elems[0] = (uchar)in_1;
      v.first._M_elems[1] = in_1._1_1_;
      v.first._M_elems[2] = in_1._2_1_;
      v.first._M_elems[3] = in_1._3_1_;
      v.second = p6.m_tokens.
                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_start._2_2_ << 8 |
                 p6.m_tokens.
                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_start._2_2_ >> 8;
      in_1 = pcVar19;
      _Var18 = ::std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,4ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                         ((this->super_ut_pex_peer_store).m_peers.
                          super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->super_ut_pex_peer_store).m_peers.
                          super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&v);
      in = extraout_RDX;
      if ((_Var18._M_current !=
           (this->super_ut_pex_peer_store).m_peers.
           super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (bVar30 = ::std::operator==(_Var18._M_current,&v), in = extraout_RDX_00, bVar30)) {
        ::std::
        vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
        ::erase(&(this->super_ut_pex_peer_store).m_peers,(const_iterator)_Var18._M_current);
        in = extraout_RDX_01;
      }
    }
  }
  key_00._M_str = "added";
  key_00._M_len = 5;
  bdecode_node::dict_find_string(&pf,&pex_msg,key_00);
  bdecode_node::operator=(&p,&pf);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&pf);
  key_01._M_str = "added.f";
  key_01._M_len = 7;
  bdecode_node::dict_find_string(&pf,&pex_msg,key_01);
  bVar30 = bdecode_node::operator_cast_to_bool(&p);
  local_22c = 0;
  if (bVar30) {
    iVar10 = bdecode_node::string_length(&p);
    local_22c = iVar10 / 6;
  }
  bVar30 = bdecode_node::operator_cast_to_bool(&p);
  if ((bVar30) && (bVar30 = bdecode_node::operator_cast_to_bool(&pf), bVar30)) {
    iVar10 = bdecode_node::string_length(&pf);
    iVar11 = bdecode_node::string_length(&p);
    if (iVar10 != iVar11 / 6) goto LAB_00347d71;
    uVar12 = bdecode_node::string_length(&pf);
    in_1 = bdecode_node::string_ptr(&p);
    pcVar19 = bdecode_node::string_ptr(&pf);
    uVar29 = 0;
    uVar28 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar28 = uVar29;
    }
    bVar30 = false;
    ppcVar25 = extraout_RDX_02;
    for (; local_238 = (int)uVar28, local_238 != (int)uVar29; uVar29 = uVar29 + 1) {
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&v,(aux *)&in_1,ppcVar25);
      bVar1 = pcVar19[uVar29];
      ppVar2 = (this->super_ut_pex_peer_store).m_peers.
               super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = (this->super_ut_pex_peer_store).m_peers.
               super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar20 = aux::torrent::settings(this->m_torrent);
      iVar10 = aux::session_settings::get_int(psVar20,0x404b);
      if (iVar10 <= (int)(((long)ppVar2 - (long)ppVar3) / 6)) break;
      if (v.first._M_elems._0_2_ != 2) {
        p6.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._8_16_ = local_220.__in6_u;
        p6.m_root_tokens = (bdecode_token *)(local_210 & 0xffffffff);
        p6.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = (in4_addr_type)0;
      }
      else {
        p6.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        p6.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p6.m_root_tokens = (bdecode_token *)0x0;
        p6.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = stack0xfffffffffffffddc;
      }
      p6.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)(v.first._M_elems._0_2_ != 2);
      bVar7 = aux::is_local((address *)&p6);
      if (bVar7) {
        iVar10 = (*(this->m_pc->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
        psVar21 = (short *)CONCAT44(extraout_var,iVar10);
        if (*psVar21 != 2) {
          p6f.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._8_16_ = *(undefined1 (*) [16])(psVar21 + 4);
          p6f.m_root_tokens = (bdecode_token *)(ulong)*(uint *)(psVar21 + 0xc);
          uVar13 = 0;
        }
        else {
          uVar13 = *(undefined4 *)(psVar21 + 2);
          p6f.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          p6f.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p6f.m_root_tokens = (bdecode_token *)0x0;
        }
        p6f.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar13,(uint)(*psVar21 != 2));
        bVar7 = aux::is_local((address *)&p6f);
        ppcVar25 = extraout_RDX_03;
        if (bVar7) goto LAB_00347c88;
      }
      else {
LAB_00347c88:
        if (v.first._M_elems._0_2_ != 2) {
          p6.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._8_16_ = local_220.__in6_u;
          p6.m_root_tokens = (bdecode_token *)(local_210 & 0xffffffff);
          p6.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = (in4_addr_type)0;
        }
        else {
          p6.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          p6.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p6.m_root_tokens = (bdecode_token *)0x0;
          p6.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = stack0xfffffffffffffddc;
        }
        p6.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)(v.first._M_elems._0_2_ != 2);
        boost::asio::ip::address::to_v4((address *)&v_2);
        p6f.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start._0_6_ =
             CONCAT24(v.first._M_elems._2_2_ << 8 | (ushort)v.first._M_elems._2_2_ >> 8,
                      v_2.first._M_elems._0_4_);
        _Var18 = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,4ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                           ((this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&p6f);
        if ((_Var18._M_current ==
             (this->super_ut_pex_peer_store).m_peers.
             super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (bVar7 = ::std::operator==(_Var18._M_current,
                                      (pair<std::array<unsigned_char,_4UL>,_unsigned_short> *)&p6f),
           ppcVar25 = extraout_RDX_04, !bVar7)) {
          ::std::
          vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
          ::insert(&(this->super_ut_pex_peer_store).m_peers,(const_iterator)_Var18._M_current,
                   (value_type *)&p6f);
          bVar30 = true;
          aux::torrent::add_peer
                    (this->m_torrent,(endpoint *)&v,(peer_source_flags_t)0x4,
                     (pex_flags_t)(bVar1 & 0x7f));
          ppcVar25 = extraout_RDX_05;
        }
      }
    }
  }
  else {
LAB_00347d71:
    bVar30 = false;
  }
  key_02._M_str = "dropped6";
  key_02._M_len = 8;
  bdecode_node::dict_find_string(&p6,&pex_msg,key_02);
  bVar7 = bdecode_node::operator_cast_to_bool(&p6);
  if (bVar7) {
    iVar10 = bdecode_node::string_length(&p6);
    iVar11 = bdecode_node::string_length(&p6);
    in_2 = bdecode_node::string_ptr(&p6);
    iVar8 = iVar10 / 0x12 + iVar8;
    ppcVar25 = &in_2;
    uVar28 = 0;
    if (0 < (int)((long)iVar11 / 0x12)) {
      uVar28 = (long)iVar11 / 0x12 & 0xffffffff;
    }
    while (iVar10 = (int)uVar28, uVar28 = (ulong)(iVar10 - 1), iVar10 != 0) {
      aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&v,(aux *)&in_2,ppcVar25);
      if (v.first._M_elems._0_2_ != 2) {
        p6f.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._8_16_ = local_220.__in6_u;
        p6f.m_root_tokens = (bdecode_token *)(local_210 & 0xffffffff);
        aVar14.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        p6f.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        p6f.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p6f.m_root_tokens = (bdecode_token *)0x0;
        aVar14.addr_.s_addr = stack0xfffffffffffffddc;
      }
      p6f.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(aVar14.addr_.s_addr,(uint)(v.first._M_elems._0_2_ != 2));
      boost::asio::ip::address::to_v6((address_v6 *)&in_1,(address *)&p6f);
      aVar6 = aStack_1c0;
      v_2.second = v.first._M_elems._2_2_ << 8 | (ushort)v.first._M_elems._2_2_ >> 8;
      v_2.first._M_elems._0_8_ = in_1;
      v_2.first._M_elems[8] = aStack_1c0.__u6_addr8[0];
      v_2.first._M_elems[9] = aStack_1c0.__u6_addr8[1];
      v_2.first._M_elems[10] = aStack_1c0.__u6_addr8[2];
      v_2.first._M_elems[0xb] = aStack_1c0.__u6_addr8[3];
      v_2.first._M_elems[0xc] = aStack_1c0.__u6_addr8[4];
      v_2.first._M_elems[0xd] = aStack_1c0.__u6_addr8[5];
      v_2.first._M_elems[0xe] = aStack_1c0.__u6_addr8[6];
      v_2.first._M_elems[0xf] = aStack_1c0.__u6_addr8[7];
      aStack_1c0 = aVar6;
      _Var22 = ::std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,16ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                         ((this->super_ut_pex_peer_store).m_peers6.
                          super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->super_ut_pex_peer_store).m_peers6.
                          super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&v_2);
      ppcVar25 = extraout_RDX_06;
      if ((_Var22._M_current !=
           (this->super_ut_pex_peer_store).m_peers6.
           super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (bVar7 = ::std::operator==(_Var22._M_current,&v_2), ppcVar25 = extraout_RDX_07, bVar7)) {
        ::std::
        vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
        ::erase(&(this->super_ut_pex_peer_store).m_peers6,(const_iterator)_Var22._M_current);
        ppcVar25 = extraout_RDX_08;
      }
    }
  }
  key_03._M_str = "added6";
  key_03._M_len = 6;
  bdecode_node::dict_find_string(&p6f,&pex_msg,key_03);
  bdecode_node::operator=(&p6,&p6f);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&p6f);
  bVar7 = bdecode_node::operator_cast_to_bool(&p6);
  if (bVar7) {
    iVar10 = bdecode_node::string_length(&p6);
    local_22c = local_22c + iVar10 / 0x12;
  }
  key_04._M_str = "added6.f";
  key_04._M_len = 8;
  bdecode_node::dict_find_string(&p6f,&pex_msg,key_04);
  bVar7 = bdecode_node::operator_cast_to_bool(&p6);
  if ((bVar7) && (bVar7 = bdecode_node::operator_cast_to_bool(&p6f), bVar7)) {
    iVar10 = bdecode_node::string_length(&p6f);
    iVar11 = bdecode_node::string_length(&p6);
    if (iVar10 == iVar11 / 0x12) {
      uVar12 = bdecode_node::string_length(&p6f);
      in_3 = bdecode_node::string_ptr(&p6);
      pcVar19 = bdecode_node::string_ptr(&p6f);
      uVar29 = 0;
      ppcVar25 = extraout_RDX_09;
      uVar28 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar28 = uVar29;
      }
      for (; local_238 = (int)uVar28, local_238 != (int)uVar29; uVar29 = uVar29 + 1) {
        aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                  ((basic_endpoint<boost::asio::ip::tcp> *)&v_2,(aux *)&in_3,ppcVar25);
        bVar1 = pcVar19[uVar29];
        if (v_2.first._M_elems._0_2_ != 2) {
          register0x00000000 = (in4_addr_type)0;
        }
        else {
          unique0x10001585 = (in4_addr_type)(in4_addr_type)v_2.first._M_elems._4_4_;
        }
        v.first._M_elems[1] = '\0';
        v.first._M_elems[2] = '\0';
        v.first._M_elems[3] = '\0';
        v.first._M_elems[0] = v_2.first._M_elems._0_2_ != 2;
        bVar7 = aux::is_local((address *)&v);
        if (bVar7) {
          iVar10 = (*(this->m_pc->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
          psVar21 = (short *)CONCAT44(extraout_var_00,iVar10);
          if (*psVar21 != 2) {
            aStack_1c0 = *(anon_union_16_3_a3f0114d_for___in6_u *)(psVar21 + 4);
            local_1b0 = (ulong)*(uint *)(psVar21 + 0xc);
            uVar13 = 0;
          }
          else {
            uVar13 = *(undefined4 *)(psVar21 + 2);
            aStack_1c0 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
            local_1b0 = 0;
          }
          in_1 = (char *)CONCAT44(uVar13,(uint)(*psVar21 != 2));
          bVar7 = aux::is_local((address *)&in_1);
          ppcVar25 = extraout_RDX_10;
          if (bVar7) goto LAB_0034811c;
        }
        else {
LAB_0034811c:
          ppVar4 = (this->super_ut_pex_peer_store).m_peers6.
                   super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ppVar5 = (this->super_ut_pex_peer_store).m_peers6.
                   super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          psVar20 = aux::torrent::settings(this->m_torrent);
          iVar10 = aux::session_settings::get_int(psVar20,0x404b);
          if (iVar10 <= (int)(((long)ppVar4 - (long)ppVar5) / 0x12)) break;
          if (v_2.first._M_elems._0_2_ != 2) {
            register0x00000000 = (in4_addr_type)0;
          }
          else {
            unique0x10001589 = (in4_addr_type)(in4_addr_type)v_2.first._M_elems._4_4_;
          }
          v.first._M_elems[1] = '\0';
          v.first._M_elems[2] = '\0';
          v.first._M_elems[3] = '\0';
          v.first._M_elems[0] = v_2.first._M_elems._0_2_ != 2;
          boost::asio::ip::address::to_v6((address_v6 *)&in_1,(address *)&v);
          aVar6 = aStack_1c0;
          local_118 = v_2.first._M_elems._2_2_ << 8 | (ushort)v_2.first._M_elems._2_2_ >> 8;
          in_2 = in_1;
          auStack_120[0] = aStack_1c0.__u6_addr8[0];
          auStack_120[1] = aStack_1c0.__u6_addr8[1];
          auStack_120[2] = aStack_1c0.__u6_addr8[2];
          auStack_120[3] = aStack_1c0.__u6_addr8[3];
          auStack_120[4] = aStack_1c0.__u6_addr8[4];
          auStack_120[5] = aStack_1c0.__u6_addr8[5];
          auStack_120[6] = aStack_1c0.__u6_addr8[6];
          auStack_120[7] = aStack_1c0.__u6_addr8[7];
          aStack_1c0 = aVar6;
          _Var22 = ::std::
                   __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,16ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                             ((this->super_ut_pex_peer_store).m_peers6.
                              super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (this->super_ut_pex_peer_store).m_peers6.
                              super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&in_2);
          if ((_Var22._M_current ==
               (this->super_ut_pex_peer_store).m_peers6.
               super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (bVar7 = ::std::operator==(_Var22._M_current,
                                        (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                                        &in_2), ppcVar25 = extraout_RDX_11, !bVar7)) {
            ::std::
            vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
            ::insert(&(this->super_ut_pex_peer_store).m_peers6,(const_iterator)_Var22._M_current,
                     (value_type *)&in_2);
            bVar30 = true;
            aux::torrent::add_peer
                      (this->m_torrent,(endpoint *)&v_2,(peer_source_flags_t)0x4,
                       (pex_flags_t)(bVar1 & 0x7f));
            ppcVar25 = extraout_RDX_12;
          }
        }
      }
    }
  }
  aux::peer_connection::peer_log
            (this->m_pc,incoming_message,"PEX","dropped: %d added: %d",iVar8,(ulong)local_22c);
  counters::inc_stats_counter(this->m_pc->m_counters,0x52,1);
  if (bVar30) {
    aux::torrent::do_connect_boost(this->m_torrent);
  }
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&p6f);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&p6);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&pf);
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&p);
LAB_003479fe:
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&pex_msg);
  return bVar26;
}

Assistant:

bool on_extended(int const length, int const msg, span<char const> body) override
		{
			if (msg != extension_index) return false;
			if (m_message_index == 0) return false;

			if (m_torrent.flags() & torrent_flags::disable_pex) return true;

			if (length > 500 * 1024)
			{
				m_pc.disconnect(errors::pex_message_too_large, operation_t::bittorrent, peer_connection_interface::peer_error);
				return true;
			}

			if (int(body.size()) < length) return true;

			time_point const now = aux::time_now();
			if (now - seconds(60) <  m_last_pex[0])
			{
				// this client appears to be trying to flood us
				// with pex messages. Don't allow that.
				m_pc.disconnect(errors::too_frequent_pex, operation_t::bittorrent);
				return true;
			}

			int const num_pex_timers = sizeof(m_last_pex) / sizeof(m_last_pex[0]);
			for (int i = 0; i < num_pex_timers - 1; ++i)
				m_last_pex[i] = m_last_pex[i + 1];
			m_last_pex[num_pex_timers - 1] = now;

			bdecode_node pex_msg;
			error_code ec;
			int const ret = bdecode(body.begin(), body.end(), pex_msg, ec);
			if (ret != 0 || pex_msg.type() != bdecode_node::dict_t)
			{
				m_pc.disconnect(errors::invalid_pex_message, operation_t::bittorrent, peer_connection_interface::peer_error);
				return true;
			}

			bdecode_node p = pex_msg.dict_find_string("dropped");

#ifndef TORRENT_DISABLE_LOGGING
			int num_dropped = 0;
			int num_added = 0;
			if (p) num_dropped += p.string_length() / 6;
#endif
			if (p)
			{
				int const num_peers = p.string_length() / 6;
				char const* in = p.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v4_endpoint<tcp::endpoint>(in);
					peers4_t::value_type const v(adr.address().to_v4().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers.begin(), m_peers.end(), v);
					if (j != m_peers.end() && *j == v) m_peers.erase(j);
				}
			}

			p = pex_msg.dict_find_string("added");
			bdecode_node const pf = pex_msg.dict_find_string("added.f");

			bool peers_added = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (p) num_added += p.string_length() / 6;
#endif
			if (p && pf && pf.string_length() == p.string_length() / 6)
			{
				int const num_peers = pf.string_length();
				char const* in = p.string_ptr();
				char const* fin = pf.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v4_endpoint<tcp::endpoint>(in);
					pex_flags_t flags(static_cast<std::uint8_t>(*fin++));

					// this is an internal flag. disregard it from the internet
					flags &= ~pex_lt_v2;

					if (int(m_peers.size()) >= m_torrent.settings().get_int(settings_pack::max_pex_peers))
						break;

					// ignore local addresses unless the peer is local to us
					if (aux::is_local(adr.address()) && !aux::is_local(m_pc.remote().address())) continue;

					peers4_t::value_type const v(adr.address().to_v4().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers.begin(), m_peers.end(), v);
					// do we already know about this peer?
					if (j != m_peers.end() && *j == v) continue;
					m_peers.insert(j, v);
					m_torrent.add_peer(adr, peer_info::pex, flags);
					peers_added = true;
				}
			}

			bdecode_node p6 = pex_msg.dict_find_string("dropped6");
			if (p6)
			{
#ifndef TORRENT_DISABLE_LOGGING
				num_dropped += p6.string_length() / 18;
#endif
				int const num_peers = p6.string_length() / 18;
				char const* in = p6.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v6_endpoint<tcp::endpoint>(in);
					peers6_t::value_type const v(adr.address().to_v6().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers6.begin(), m_peers6.end(), v);
					if (j != m_peers6.end() && *j == v) m_peers6.erase(j);
				}
			}

			p6 = pex_msg.dict_find_string("added6");
#ifndef TORRENT_DISABLE_LOGGING
			if (p6) num_added += p6.string_length() / 18;
#endif
			bdecode_node const p6f = pex_msg.dict_find_string("added6.f");
			if (p6 && p6f && p6f.string_length() == p6.string_length() / 18)
			{
				int const num_peers = p6f.string_length();
				char const* in = p6.string_ptr();
				char const* fin = p6f.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v6_endpoint<tcp::endpoint>(in);
					pex_flags_t flags(static_cast<std::uint8_t>(*fin++));

					// this is an internal flag. disregard it from the internet
					flags &= ~pex_lt_v2;

					// ignore local addresses unless the peer is local to us
					if (aux::is_local(adr.address()) && !aux::is_local(m_pc.remote().address())) continue;
					if (int(m_peers6.size()) >= m_torrent.settings().get_int(settings_pack::max_pex_peers))
						break;

					peers6_t::value_type const v(adr.address().to_v6().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers6.begin(), m_peers6.end(), v);
					// do we already know about this peer?
					if (j != m_peers6.end() && *j == v) continue;
					m_peers6.insert(j, v);
					m_torrent.add_peer(adr, peer_info::pex, flags);
					peers_added = true;
				}
			}
#ifndef TORRENT_DISABLE_LOGGING
			m_pc.peer_log(peer_log_alert::incoming_message, "PEX", "dropped: %d added: %d"
				, num_dropped, num_added);
#endif

			m_pc.stats_counters().inc_stats_counter(counters::num_incoming_pex);

			if (peers_added) m_torrent.do_connect_boost();
			return true;
		}